

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void __thiscall
cxxopts::argument_incorrect_type::~argument_incorrect_type(argument_incorrect_type *this)

{
  void *in_RDI;
  
  ~argument_incorrect_type((argument_incorrect_type *)0x1626f8);
  operator_delete(in_RDI,0x28);
  return;
}

Assistant:

explicit argument_incorrect_type
    (
      const std::string& arg
    )
    : OptionParseException(
        "Argument " + LQUOTE + arg + RQUOTE + " failed to parse"
      )
    {
    }